

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O0

c8 * __thiscall
irr::scene::COBJMeshFileLoader::readColor
          (COBJMeshFileLoader *this,c8 *bufPtr,SColor *color,c8 *bufEnd)

{
  u32 uVar1;
  c8 *pcVar2;
  SColor *in_RDX;
  undefined8 in_RDI;
  c8 colStr [16];
  u32 COLOR_BUFFER_LENGTH;
  SColor *this_00;
  c8 *in_stack_ffffffffffffffb0;
  SColor *this_01;
  u32 outBufLength;
  c8 *in_stack_ffffffffffffffc0;
  c8 *in_stack_ffffffffffffffc8;
  COBJMeshFileLoader *in_stack_ffffffffffffffd0;
  
  outBufLength = (u32)((ulong)in_RDI >> 0x20);
  goAndCopyNextWord(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    outBufLength,in_stack_ffffffffffffffb0);
  this_00 = in_RDX;
  core::fast_atof(in_stack_ffffffffffffffb0,(char **)in_RDX);
  uVar1 = core::round32(0.0);
  video::SColor::setRed(this_00,uVar1);
  goAndCopyNextWord(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    outBufLength,in_stack_ffffffffffffffb0);
  this_01 = in_RDX;
  core::fast_atof((char *)in_RDX,(char **)this_00);
  uVar1 = core::round32(0.0);
  video::SColor::setGreen(this_01,uVar1);
  pcVar2 = goAndCopyNextWord(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,outBufLength,(c8 *)this_01);
  core::fast_atof((char *)this_01,(char **)this_00);
  uVar1 = core::round32(0.0);
  video::SColor::setBlue(in_RDX,uVar1);
  return pcVar2;
}

Assistant:

const c8 *COBJMeshFileLoader::readColor(const c8 *bufPtr, video::SColor &color, const c8 *const bufEnd)
{
	const u32 COLOR_BUFFER_LENGTH = 16;
	c8 colStr[COLOR_BUFFER_LENGTH];

	bufPtr = goAndCopyNextWord(colStr, bufPtr, COLOR_BUFFER_LENGTH, bufEnd);
	color.setRed((u32)core::round32(core::fast_atof(colStr) * 255.f));
	bufPtr = goAndCopyNextWord(colStr, bufPtr, COLOR_BUFFER_LENGTH, bufEnd);
	color.setGreen((u32)core::round32(core::fast_atof(colStr) * 255.f));
	bufPtr = goAndCopyNextWord(colStr, bufPtr, COLOR_BUFFER_LENGTH, bufEnd);
	color.setBlue((u32)core::round32(core::fast_atof(colStr) * 255.f));
	return bufPtr;
}